

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

void FAudioFXReverb_Process
               (FAudioFXReverb *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  DspReverb *reverb;
  DspReverbChannel *pDVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  FAPOBufferFlags FVar4;
  int iVar5;
  undefined8 uVar6;
  uint8_t uVar17;
  FAudioFXReverbParameters *params;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  DspReverbChannel *pDVar23;
  float *pfVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float *in_end;
  float late [4];
  float local_8c;
  FAudioFXReverbParameters local_68;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined5 uVar9;
  undefined1 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined1 uVar14;
  undefined2 uVar15;
  undefined1 uVar16;
  
  uVar17 = FAPOBase_ParametersChanged(&fapo->base);
  FVar4 = pInputProcessParameters->BufferFlags;
  if (IsEnabled != 0) {
    if (FVar4 == FAPO_BUFFER_SILENT) {
      SDL_memset(pInputProcessParameters->pBuffer,0,
                 (uint)fapo->inBlockAlign * pInputProcessParameters->ValidFrameCount);
    }
    params = (FAudioFXReverbParameters *)FAPOBase_BeginProcess(&fapo->base);
    if (uVar17 != '\0') {
      if (fapo->apiVersion == '\t') {
        local_68.WetDryMix = params->WetDryMix;
        local_68.ReflectionsDelay = params->ReflectionsDelay;
        local_68.ReverbDelay = params->ReverbDelay;
        local_68.RearDelay = params->RearDelay;
        uVar6._0_1_ = params->PositionRight;
        uVar6._1_1_ = params->PositionMatrixLeft;
        uVar7 = params->PositionMatrixRight;
        uVar8 = params->EarlyDiffusion;
        uVar10 = params->LateDiffusion;
        uVar12 = params->LowEQGain;
        uVar14 = params->LowEQCutoff;
        uVar16 = params->HighEQGain;
        uVar15 = CONCAT11(uVar16,uVar14);
        uVar13 = CONCAT21(uVar15,uVar12);
        uVar11 = CONCAT31(uVar13,uVar10);
        uVar9 = CONCAT41(uVar11,uVar8);
        uVar6._2_6_ = CONCAT51(uVar9,uVar7);
        local_68._10_2_ = SUB82(uVar6,0);
        local_68._12_4_ = SUB64(uVar6._2_6_,0);
        local_68.HighEQGain = params->HighEQCutoff;
        local_68.HighEQCutoff = *(uint8_t *)&params->RoomFilterFreq;
        local_68._20_8_ = *(undefined8 *)((long)&params->RoomFilterFreq + 1);
        local_68._28_8_ = *(undefined8 *)((long)&params->RoomFilterHF + 1);
        local_68._36_8_ = *(undefined8 *)((long)&params->ReverbGain + 1);
        local_68._44_8_ = *(undefined8 *)((long)&params->Density + 1);
        params = &local_68;
        local_68._16_2_ = uVar15;
      }
      DspReverb_SetParameters(&fapo->reverb,params);
    }
    reverb = &fapo->reverb;
    iVar5 = (fapo->reverb).out_channels;
    if (iVar5 == 2) {
      pfVar20 = (float *)pInputProcessParameters->pBuffer;
      pfVar19 = (float *)pOutputProcessParameters->pBuffer;
      pfVar24 = pfVar20 + (uint)fapo->inChannels * pInputProcessParameters->ValidFrameCount;
      local_8c = 0.0;
      for (; pfVar20 < pfVar24; pfVar20 = pfVar20 + 2) {
        fVar26 = (*pfVar20 + pfVar20[1]) * 0.5;
        fVar27 = (fapo->reverb).dry_ratio;
        fVar28 = DspReverb_INTERNAL_ProcessEarly(reverb,fVar26);
        fVar29 = DspReverb_INTERNAL_ProcessChannel(reverb,(fapo->reverb).channel,fVar28);
        fVar28 = DspReverb_INTERNAL_ProcessChannel(reverb,(fapo->reverb).channel + 1,fVar28);
        fVar27 = fVar28 * (fapo->reverb).wet_ratio + fVar27 * fVar26;
        *pfVar19 = fVar29;
        pfVar19[1] = fVar27;
        local_8c = local_8c + fVar29 * fVar29 + fVar27 * fVar27;
        pfVar19 = pfVar19 + 2;
      }
    }
    else if (iVar5 == 1) {
      pfVar20 = (float *)pInputProcessParameters->pBuffer;
      pfVar19 = (float *)pOutputProcessParameters->pBuffer;
      pfVar24 = pfVar20 + (uint)fapo->inChannels * pInputProcessParameters->ValidFrameCount;
      local_8c = 0.0;
      for (; pfVar20 < pfVar24; pfVar20 = pfVar20 + 1) {
        fVar27 = *pfVar20;
        fVar26 = DspReverb_INTERNAL_ProcessEarly(reverb,fVar27);
        fVar26 = DspReverb_INTERNAL_ProcessChannel(reverb,(fapo->reverb).channel,fVar26);
        fVar27 = fVar26 * (fapo->reverb).wet_ratio + fVar27 * (fapo->reverb).dry_ratio;
        *pfVar19 = fVar27;
        local_8c = local_8c + fVar27 * fVar27;
        pfVar19 = pfVar19 + 1;
      }
    }
    else {
      iVar5 = (fapo->reverb).in_channels;
      pfVar24 = (float *)pInputProcessParameters->pBuffer;
      pfVar20 = (float *)pOutputProcessParameters->pBuffer;
      pfVar19 = pfVar24 + (uint)fapo->inChannels * pInputProcessParameters->ValidFrameCount;
      pDVar1 = (fapo->reverb).channel;
      if (iVar5 == 2) {
        local_8c = 0.0;
        for (; pfVar24 < pfVar19; pfVar24 = pfVar24 + 2) {
          fVar26 = (*pfVar24 + pfVar24[1]) * 0.5;
          fVar27 = (fapo->reverb).dry_ratio;
          fVar28 = DspReverb_INTERNAL_ProcessEarly(reverb,fVar26);
          pDVar23 = pDVar1;
          for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
            fVar29 = DspReverb_INTERNAL_ProcessChannel(reverb,pDVar23,fVar28);
            fVar29 = fVar29 * (fapo->reverb).wet_ratio + fVar27 * fVar26;
            (&local_68.WetDryMix)[lVar25] = fVar29;
            local_8c = local_8c + fVar29 * fVar29;
            pDVar23 = pDVar23 + 1;
          }
          *(ulong *)pfVar20 = CONCAT44(local_68.ReflectionsDelay,local_68.WetDryMix);
          pfVar20[2] = 0.0;
          pfVar20[3] = 0.0;
          *(ulong *)(pfVar20 + 4) =
               CONCAT44(local_68._12_4_,
                        CONCAT22(local_68._10_2_,CONCAT11(local_68.RearDelay,local_68.ReverbDelay)))
          ;
          pfVar20 = pfVar20 + 6;
        }
      }
      else if (iVar5 == 1) {
        local_8c = 0.0;
        for (; pfVar24 < pfVar19; pfVar24 = pfVar24 + 1) {
          fVar27 = *pfVar24;
          fVar26 = (fapo->reverb).dry_ratio;
          fVar28 = DspReverb_INTERNAL_ProcessEarly(reverb,fVar27);
          pDVar23 = pDVar1;
          for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
            fVar29 = DspReverb_INTERNAL_ProcessChannel(reverb,pDVar23,fVar28);
            fVar29 = fVar29 * (fapo->reverb).wet_ratio + fVar26 * fVar27;
            (&local_68.WetDryMix)[lVar25] = fVar29;
            local_8c = local_8c + fVar29 * fVar29;
            pDVar23 = pDVar23 + 1;
          }
          *(ulong *)pfVar20 = CONCAT44(local_68.ReflectionsDelay,local_68.WetDryMix);
          pfVar20[2] = 0.0;
          pfVar20[3] = 0.0;
          *(ulong *)(pfVar20 + 4) =
               CONCAT44(local_68._12_4_,
                        CONCAT22(local_68._10_2_,CONCAT11(local_68.RearDelay,local_68.ReverbDelay)))
          ;
          pfVar20 = pfVar20 + 6;
        }
      }
      else {
        local_8c = 0.0;
        for (; pfVar24 < pfVar19; pfVar24 = pfVar24 + 6) {
          fVar26 = (*pfVar24 + pfVar24[1] + pfVar24[2] + pfVar24[4] + pfVar24[5]) / 5.0;
          fVar27 = (fapo->reverb).dry_ratio;
          fVar28 = DspReverb_INTERNAL_ProcessEarly(reverb,fVar26);
          pDVar23 = pDVar1;
          for (lVar25 = 0; lVar25 != 5; lVar25 = lVar25 + 1) {
            fVar29 = DspReverb_INTERNAL_ProcessChannel(reverb,pDVar23,fVar28);
            fVar29 = fVar29 * (fapo->reverb).wet_ratio + fVar27 * fVar26;
            (&local_68.WetDryMix)[lVar25] = fVar29;
            local_8c = local_8c + fVar29 * fVar29;
            pDVar23 = pDVar23 + 1;
          }
          fVar27 = pfVar24[3];
          *pfVar20 = local_68.WetDryMix;
          pfVar20[1] = (float)local_68.ReflectionsDelay;
          pfVar20[2] = (float)CONCAT22(local_68._10_2_,
                                       CONCAT11(local_68.RearDelay,local_68.ReverbDelay));
          pfVar20[3] = fVar27;
          *(ulong *)(pfVar20 + 4) =
               CONCAT17(local_68.HighEQCutoff,
                        CONCAT16(local_68.HighEQGain,CONCAT24(local_68._16_2_,local_68._12_4_)));
          pfVar20 = pfVar20 + 6;
        }
      }
    }
    pOutputProcessParameters->BufferFlags = (uint)(1e-07 <= local_8c);
    FAPOBase_EndProcess(&fapo->base);
    return;
  }
  pOutputProcessParameters->BufferFlags = FVar4;
  if (FVar4 != FAPO_BUFFER_SILENT) {
    puVar21 = (undefined8 *)pInputProcessParameters->pBuffer;
    puVar22 = (undefined8 *)pOutputProcessParameters->pBuffer;
    if (puVar21 != puVar22) {
      uVar18 = (ulong)pInputProcessParameters->ValidFrameCount;
      if (fapo->inBlockAlign == fapo->outBlockAlign) {
        SDL_memcpy(puVar22,puVar21,fapo->inBlockAlign * uVar18);
        return;
      }
      if (fapo->inChannels == 2) {
        if (fapo->outChannels != 6) goto LAB_00115609;
        puVar2 = puVar21 + uVar18;
        for (; puVar21 < puVar2; puVar21 = puVar21 + 1) {
          *puVar22 = *puVar21;
          puVar22[1] = 0;
          puVar22[2] = 0;
          puVar22 = puVar22 + 3;
        }
      }
      else {
        if ((fapo->inChannels != 1) || (fapo->outChannels != 6)) {
LAB_00115609:
          SDL_memset(puVar22,0,fapo->outBlockAlign * uVar18);
          return;
        }
        puVar2 = (undefined8 *)((long)puVar21 + uVar18 * 4);
        for (; puVar21 < puVar2; puVar21 = (undefined8 *)((long)puVar21 + 4)) {
          uVar3 = *(undefined4 *)puVar21;
          *(undefined4 *)puVar22 = uVar3;
          *(undefined4 *)((long)puVar22 + 4) = uVar3;
          puVar22[1] = 0;
          puVar22[2] = 0;
          puVar22 = puVar22 + 3;
        }
      }
    }
  }
  return;
}

Assistant:

void FAudioFXReverb_Process(
	FAudioFXReverb *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	FAudioFXReverbParameters *params;
	uint8_t update_params = FAPOBase_ParametersChanged(&fapo->base);
	float total;
	
	/* Handle disabled filter */
	if (IsEnabled == 0)
	{
		pOutputProcessParameters->BufferFlags = pInputProcessParameters->BufferFlags;

		if (pOutputProcessParameters->BufferFlags != FAPO_BUFFER_SILENT)
		{
			FAudioFXReverb_CopyBuffer(
				fapo,
				(float*) pInputProcessParameters->pBuffer,
				(float*) pOutputProcessParameters->pBuffer,
				pInputProcessParameters->ValidFrameCount
			);
		}

		return;
	}
	
	/* XAudio2 passes a 'silent' buffer when no input buffer is available to play the effect tail */
	if (pInputProcessParameters->BufferFlags == FAPO_BUFFER_SILENT)
	{
		/* Make sure input data is usable. FIXME: Is this required? */
		FAudio_zero(
			pInputProcessParameters->pBuffer,
			pInputProcessParameters->ValidFrameCount * fapo->inBlockAlign
		);
	}

	params = (FAudioFXReverbParameters*) FAPOBase_BeginProcess(&fapo->base);

	/* Update parameters  */
	if (update_params)
	{
		if (fapo->apiVersion == 9)
		{
			DspReverb_SetParameters9(
				&fapo->reverb,
				(FAudioFXReverbParameters9*) params
			);
		}
		else
		{
			DspReverb_SetParameters(&fapo->reverb, params);
		}
	}

	/* Run reverb effect */
	#define PROCESS(pin, pout) \
		DspReverb_INTERNAL_Process_##pin##_to_##pout( \
			&fapo->reverb, \
			(float*) pInputProcessParameters->pBuffer, \
			(float*) pOutputProcessParameters->pBuffer, \
			pInputProcessParameters->ValidFrameCount * fapo->inChannels \
		)
	switch (fapo->reverb.out_channels)
	{
		case 1:
			total = PROCESS(1, 1);
			break;
		case 2:
			total = PROCESS(2, 2);
			break;
		default: /* 5.1 */
			if (fapo->reverb.in_channels == 1)
			{
				total = PROCESS(1, 5p1);
			}
			else if (fapo->reverb.in_channels == 2)
			{
				total = PROCESS(2, 5p1);
			}
			else /* 5.1 */
			{
				total = PROCESS(5p1, 5p1);
			}
			break;
	}
	#undef PROCESS

	/* Set BufferFlags to silent so PLAY_TAILS knows when to stop */
	pOutputProcessParameters->BufferFlags = (total < 0.0000001f) ?
		FAPO_BUFFER_SILENT :
		FAPO_BUFFER_VALID;

	FAPOBase_EndProcess(&fapo->base);
}